

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

CompilerHLSL * __thiscall
spirv_cross::CompilerHLSL::image_type_hlsl_legacy_abi_cxx11_
          (CompilerHLSL *this,SPIRType *type,uint32_t id)

{
  int iVar1;
  bool bVar2;
  uint32_t id_00;
  SPIRType *pSVar3;
  CompilerError *this_00;
  uint32_t in_ECX;
  undefined4 in_register_00000014;
  SPIRType *type_00;
  char *pcVar4;
  allocator local_a9;
  string local_a8 [36];
  undefined4 local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [48];
  string local_50 [8];
  string res;
  SPIRType *imagetype;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  type_00 = (SPIRType *)CONCAT44(in_register_00000014,id);
  id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type_00->image);
  pSVar3 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,id_00);
  ::std::__cxx11::string::string(local_50);
  iVar1 = *(int *)&(pSVar3->super_IVariant).field_0xc;
  if (iVar1 == 7) {
    ::std::__cxx11::string::operator=(local_50,"i");
  }
  else if (iVar1 == 8) {
    ::std::__cxx11::string::operator=(local_50,"u");
  }
  if ((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) &&
     ((type_00->image).dim == DimSubpassData)) {
    ::std::operator+(local_80,(char *)local_50);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_80);
    ::std::__cxx11::string::~string((string *)local_80);
  }
  else {
    if ((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) &&
       ((type_00->image).dim != DimSubpassData)) {
      if (((type_00->image).dim == DimBuffer) && ((type_00->image).sampled == 1)) {
        ::std::__cxx11::string::operator+=(local_50,"sampler");
      }
      else {
        pcVar4 = "texture";
        if ((type_00->image).sampled == 2) {
          pcVar4 = "image";
        }
        ::std::__cxx11::string::operator+=(local_50,pcVar4);
      }
    }
    else {
      ::std::__cxx11::string::operator+=(local_50,"sampler");
    }
    switch((type_00->image).dim) {
    case Dim1D:
      ::std::__cxx11::string::operator+=(local_50,"1D");
      break;
    case Dim2D:
      ::std::__cxx11::string::operator+=(local_50,"2D");
      break;
    case Dim3D:
      ::std::__cxx11::string::operator+=(local_50,"3D");
      break;
    case DimCube:
      ::std::__cxx11::string::operator+=(local_50,"CUBE");
      break;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_a8,"Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.",
                 &local_a9);
      CompilerError::CompilerError(this_00,(string *)local_a8);
      __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
    case DimBuffer:
      ::std::__cxx11::string::operator+=(local_50,"Buffer");
      break;
    case DimSubpassData:
      ::std::__cxx11::string::operator+=(local_50,"2D");
    }
    if (((type_00->image).ms & 1U) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"MS");
    }
    if (((type_00->image).arrayed & 1U) != 0) {
      ::std::__cxx11::string::operator+=(local_50,"Array");
    }
    bVar2 = Compiler::image_is_comparison((Compiler *)type,type_00,in_ECX);
    if (bVar2) {
      ::std::__cxx11::string::operator+=(local_50,"Shadow");
    }
    ::std::__cxx11::string::string((string *)this,local_50);
  }
  local_84 = 1;
  ::std::__cxx11::string::~string(local_50);
  return this;
}

Assistant:

string CompilerHLSL::image_type_hlsl_legacy(const SPIRType &type, uint32_t id)
{
	auto &imagetype = get<SPIRType>(type.image.type);
	string res;

	switch (imagetype.basetype)
	{
	case SPIRType::Int:
		res = "i";
		break;
	case SPIRType::UInt:
		res = "u";
		break;
	default:
		break;
	}

	if (type.basetype == SPIRType::Image && type.image.dim == DimSubpassData)
		return res + "subpassInput" + (type.image.ms ? "MS" : "");

	// If we're emulating subpassInput with samplers, force sampler2D
	// so we don't have to specify format.
	if (type.basetype == SPIRType::Image && type.image.dim != DimSubpassData)
	{
		// Sampler buffers are always declared as samplerBuffer even though they might be separate images in the SPIR-V.
		if (type.image.dim == DimBuffer && type.image.sampled == 1)
			res += "sampler";
		else
			res += type.image.sampled == 2 ? "image" : "texture";
	}
	else
		res += "sampler";

	switch (type.image.dim)
	{
	case Dim1D:
		res += "1D";
		break;
	case Dim2D:
		res += "2D";
		break;
	case Dim3D:
		res += "3D";
		break;
	case DimCube:
		res += "CUBE";
		break;

	case DimBuffer:
		res += "Buffer";
		break;

	case DimSubpassData:
		res += "2D";
		break;
	default:
		SPIRV_CROSS_THROW("Only 1D, 2D, 3D, Buffer, InputTarget and Cube textures supported.");
	}

	if (type.image.ms)
		res += "MS";
	if (type.image.arrayed)
		res += "Array";
	if (image_is_comparison(type, id))
		res += "Shadow";

	return res;
}